

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  pointer pBVar2;
  Layer *pLVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  int *piVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  int j;
  long lVar11;
  long lVar12;
  size_t sStack_400;
  allocator<char> local_3f1;
  int top_count;
  int bottom_count;
  Layer *local_3e8;
  int blob_count;
  ulong local_3d8;
  int layer_count;
  Mat local_3c8;
  ulong local_378;
  vector<int,_std::allocator<int>_> *local_370;
  int magic;
  string *local_360;
  vector<int,_std::allocator<int>_> *local_358;
  ParamDict pd;
  Mat shape_hints;
  char layer_type [256];
  char layer_name [256];
  
  magic = 0;
  iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar5 == 1) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar5 == 1) {
        iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d",&blob_count);
        if (iVar5 == 1) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)layer_count);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar8 = 0;
            local_3d8 = 0;
            do {
              if ((long)layer_count <= (long)uVar8) {
                NetPrivate::update_input_output_indexes(this->d);
                iVar5 = 0;
                NetPrivate::update_input_output_names(this->d);
LAB_001450d8:
                ParamDict::~ParamDict(&pd);
                return iVar5;
              }
              bottom_count = 0;
              top_count = 0;
              iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_type);
              if (iVar5 != 1) {
                pcVar9 = "parse layer_type failed";
LAB_0014519d:
                sStack_400 = 0x17;
LAB_001450ab:
                fwrite(pcVar9,sStack_400,1,_stderr);
                fputc(10,_stderr);
LAB_001450bf:
                iVar5 = -1;
                goto LAB_001450d8;
              }
              iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_name);
              if (iVar5 != 1) {
                pcVar9 = "parse layer_name failed";
                goto LAB_0014519d;
              }
              iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d",&bottom_count);
              if (iVar5 != 1) {
                pcVar9 = "parse bottom_count failed";
                sStack_400 = 0x19;
                goto LAB_001450ab;
              }
              iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d",&top_count);
              if (iVar5 != 1) {
                pcVar9 = "parse top_count failed";
LAB_001450a9:
                sStack_400 = 0x16;
                goto LAB_001450ab;
              }
              local_3e8 = create_layer(layer_type);
              if (local_3e8 == (Layer *)0x0) {
                iVar5 = (*this->_vptr_Net[3])(this,layer_type);
                local_3e8 = (Layer *)CONCAT44(extraout_var,iVar5);
                if (local_3e8 != (Layer *)0x0) goto LAB_00144ac3;
                fprintf(_stderr,"layer %s not exists or registered",layer_type);
                fputc(10,_stderr);
                clear(this);
                goto LAB_001450bf;
              }
LAB_00144ac3:
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&shape_hints,layer_type,(allocator<char> *)&local_3c8);
              pLVar3 = local_3e8;
              std::__cxx11::string::operator=((string *)&local_3e8->type,(string *)&shape_hints);
              std::__cxx11::string::~string((string *)&shape_hints);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&shape_hints,layer_name,(allocator<char> *)&local_3c8);
              local_360 = &pLVar3->name;
              std::__cxx11::string::operator=((string *)local_360,(string *)&shape_hints);
              std::__cxx11::string::~string((string *)&shape_hints);
              local_358 = &pLVar3->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_358,(long)bottom_count);
              lVar12 = 0;
              local_378 = uVar8;
              while( true ) {
                uVar4 = local_3d8;
                iVar5 = (int)local_3d8;
                lVar10 = (long)(int)local_3d8;
                if (bottom_count <= lVar12) break;
                iVar6 = (*dr->_vptr_DataReader[2])(dr,"%255s",&shape_hints);
                if (iVar6 != 1) {
                  pcVar9 = "parse bottom_name failed";
                  sStack_400 = 0x18;
                  goto LAB_001450ab;
                }
                iVar6 = find_blob_index_by_name(this,(char *)&shape_hints);
                if (iVar6 == -1) {
                  pBVar2 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3c8,(char *)&shape_hints,&local_3f1);
                  std::__cxx11::string::operator=((string *)(pBVar2 + lVar10),(string *)&local_3c8);
                  std::__cxx11::string::~string((string *)&local_3c8);
                  iVar6 = (int)local_3d8;
                  local_3d8 = (ulong)(iVar5 + 1);
                  uVar8 = local_378;
                }
                else {
                  lVar10 = (long)iVar6;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[lVar10].consumer = (int)uVar8;
                (local_358->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar12] = iVar6;
                lVar12 = lVar12 + 1;
              }
              local_370 = &local_3e8->tops;
              std::vector<int,_std::allocator<int>_>::resize(local_370,(long)top_count);
              local_3d8 = uVar4 & 0xffffffff;
              lVar10 = lVar10 * 0x70;
              for (lVar12 = 0; lVar12 < top_count; lVar12 = lVar12 + 1) {
                pBVar2 = (this->d->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",&shape_hints);
                if (iVar5 != 1) {
                  pcVar9 = "parse blob_name failed";
                  goto LAB_001450a9;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c8,(char *)&shape_hints,&local_3f1);
                std::__cxx11::string::operator=
                          ((string *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar10),
                           (string *)&local_3c8);
                std::__cxx11::string::~string((string *)&local_3c8);
                *(int *)((long)&pBVar2->producer + lVar10) = (int)local_378;
                (local_370->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar12] = (int)local_3d8 + (int)lVar12;
                lVar10 = lVar10 + 0x70;
                uVar8 = local_378;
              }
              iVar5 = ParamDict::load_param(&pd,dr);
              if (iVar5 == 0) {
                if (local_3e8->support_int8_storage == true) {
                  (this->opt).use_vulkan_compute = false;
                }
                local_3c8.cstep = 0;
                local_3c8.data = (void *)0x0;
                local_3c8.refcount._0_4_ = 0;
                local_3c8.refcount._4_4_ = 0;
                local_3c8.elemsize._0_4_ = 0;
                local_3c8.elemsize._4_4_ = 0;
                local_3c8.elempack = 0;
                local_3c8.h = 0;
                local_3c8.d = 0;
                local_3c8.c = 0;
                local_3c8.allocator = (Allocator *)0x0;
                local_3c8.dims = 0;
                local_3c8.w = 0;
                ParamDict::get(&shape_hints,&pd,0x1e,&local_3c8);
                Mat::~Mat(&local_3c8);
                if ((shape_hints.data != (void *)0x0) &&
                   ((long)shape_hints.c * shape_hints.cstep != 0)) {
                  piVar7 = (int *)((long)shape_hints.data + 0xc);
                  for (lVar10 = 0; lVar10 < top_count; lVar10 = lVar10 + 1) {
                    iVar5 = (local_370->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar10];
                    pBVar2 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar6 = piVar7[-3];
                    if (iVar6 == 3) {
                      local_3c8.w = piVar7[-2];
                      local_3c8.h = piVar7[-1];
                      local_3c8.c = *piVar7;
                      local_3c8.data = (void *)0x0;
                      local_3c8.refcount._0_4_ = 0;
                      local_3c8.refcount._4_4_ = 0;
                      local_3c8.elemsize._0_4_ = 4;
                      local_3c8.elemsize._4_4_ = 0;
                      local_3c8.elempack = 1;
                      local_3c8.allocator = (Allocator *)0x0;
                      local_3c8.dims = 3;
                      local_3c8.cstep =
                           (long)local_3c8.h * (long)local_3c8.w + 3U & 0x3ffffffffffffffc;
                      local_3c8.d = local_3c8.elempack;
                      Mat::operator=(&pBVar2[iVar5].shape,&local_3c8);
LAB_00144ee3:
                      Mat::~Mat(&local_3c8);
                    }
                    else {
                      if (iVar6 == 2) {
                        local_3c8.w = piVar7[-2];
                        local_3c8.h = piVar7[-1];
                        local_3c8.data = (void *)0x0;
                        local_3c8.refcount._0_4_ = 0;
                        local_3c8.refcount._4_4_ = 0;
                        local_3c8.elemsize._0_4_ = 4;
                        local_3c8.elemsize._4_4_ = 0;
                        local_3c8.elempack = 1;
                        local_3c8.allocator = (Allocator *)0x0;
                        local_3c8.dims = 2;
                        local_3c8.d = 1;
                        local_3c8.c = 1;
                        local_3c8.cstep = (long)local_3c8.h * (long)local_3c8.w;
                        Mat::operator=(&pBVar2[iVar5].shape,&local_3c8);
                        goto LAB_00144ee3;
                      }
                      if (iVar6 == 1) {
                        local_3c8.w = piVar7[-2];
                        local_3c8.cstep = (size_t)local_3c8.w;
                        local_3c8.data = (void *)0x0;
                        local_3c8.refcount._0_4_ = 0;
                        local_3c8.refcount._4_4_ = 0;
                        local_3c8.elemsize._0_4_ = 4;
                        local_3c8.elemsize._4_4_ = 0;
                        local_3c8.elempack = 1;
                        local_3c8.allocator = (Allocator *)0x0;
                        local_3c8.h = 1;
                        local_3c8.d = 1;
                        local_3c8.dims = local_3c8.elempack;
                        local_3c8.c = local_3c8.elempack;
                        Mat::operator=(&pBVar2[iVar5].shape,&local_3c8);
                        goto LAB_00144ee3;
                      }
                    }
                    piVar7 = piVar7 + 4;
                  }
                }
                pvVar1 = &local_3e8->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar1,(long)bottom_count);
                lVar10 = 0;
                for (lVar11 = 0; lVar11 < bottom_count; lVar11 = lVar11 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar10),
                                 &(this->d->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(local_358->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar11]].shape);
                  lVar10 = lVar10 + 0x48;
                }
                pvVar1 = &local_3e8->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)top_count);
                lVar10 = 0;
                for (lVar11 = 0; lVar11 < top_count; lVar11 = lVar11 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar10),
                                 &(this->d->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(local_370->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar11]].shape);
                  lVar10 = lVar10 + 0x48;
                }
                iVar5 = (*local_3e8->_vptr_Layer[2])(local_3e8,&pd);
                uVar8 = local_378;
                if (iVar5 == 0) {
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_378] = local_3e8;
                }
                else {
                  fprintf(_stderr,"layer load_param %d %s failed",local_378 & 0xffffffff,
                          (local_360->_M_dataplus)._M_p);
                  fputc(10,_stderr);
                }
                Mat::~Mat(&shape_hints);
              }
              else {
                fprintf(_stderr,"ParamDict load_param %d %s failed",uVar8 & 0xffffffff,
                        (local_360->_M_dataplus)._M_p);
                fputc(10,_stderr);
              }
              local_3d8 = local_3d8 + lVar12;
              uVar8 = uVar8 + 1;
            } while( true );
          }
          pcVar9 = "invalid layer_count or blob_count";
          sStack_400 = 0x21;
        }
        else {
          pcVar9 = "parse blob_count failed";
          sStack_400 = 0x17;
        }
      }
      else {
        pcVar9 = "parse layer_count failed";
        sStack_400 = 0x18;
      }
    }
    else {
      pcVar9 = "param is too old, please regenerate";
      sStack_400 = 0x23;
    }
  }
  else {
    pcVar9 = "parse magic failed";
    sStack_400 = 0x12;
  }
  fwrite(pcVar9,sStack_400,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}